

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::enterRubberBandMode(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_01;
  QPoint QVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = QWidget::isMaximized(this_00);
  if (!bVar1) {
    if (this->rubberBand == (QRubberBand *)0x0) {
      this_01.m_data = operator_new(0x28);
      QRubberBand::QRubberBand
                ((QRubberBand *)this_01.m_data,Rectangle,
                 *(QWidget **)(*(long *)&this_00->field_0x8 + 0x10));
      this->rubberBand = (QRubberBand *)this_01;
      QVar3.m_size = (size_t)"qt_rubberband";
      QVar3.field_0.m_data = this_01.m_data;
      QObject::setObjectName(QVar3);
    }
    local_28.xp.m_i = 0;
    local_28.yp.m_i = 0;
    QVar2 = QWidget::mapToParent(this_00,&local_28);
    QRubberBand::setGeometry
              (this->rubberBand,QVar2.xp.m_i.m_i,QVar2.yp.m_i.m_i,
               ((this->oldGeometry).x2.m_i - (this->oldGeometry).x1.m_i) + 1,
               ((this->oldGeometry).y2.m_i - (this->oldGeometry).y1.m_i) + 1);
    QWidget::show(&this->rubberBand->super_QWidget);
    this->isInRubberBandMode = true;
    QWidget::grabMouse(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::enterRubberBandMode()
{
    Q_Q(QMdiSubWindow);
    if (q->isMaximized())
        return;
    Q_ASSERT(oldGeometry.isValid());
    Q_ASSERT(parent);
    if (!rubberBand) {
        rubberBand = new QRubberBand(QRubberBand::Rectangle, q->parentWidget());
        // For accessibility to identify this special widget.
        rubberBand->setObjectName("qt_rubberband"_L1);
    }
    QPoint rubberBandPos = q->mapToParent(QPoint(0, 0));
    rubberBand->setGeometry(rubberBandPos.x(), rubberBandPos.y(),
                            oldGeometry.width(), oldGeometry.height());
    rubberBand->show();
    isInRubberBandMode = true;
    q->grabMouse();
}